

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2test.c
# Opt level: O0

int pchars8(PCRE2_SPTR8 p,int length,BOOL utf,FILE *f)

{
  size_t sVar1;
  int iVar2;
  int local_28;
  int rc;
  int yield;
  uint32_t c;
  FILE *f_local;
  BOOL utf_local;
  int length_local;
  PCRE2_SPTR8 p_local;
  
  rc = 0;
  local_28 = 0;
  _yield = f;
  f_local._0_4_ = utf;
  f_local._4_4_ = length;
  _utf_local = p;
  if (length < 0) {
    sVar1 = strlen((char *)p);
    f_local._4_4_ = (int)sVar1;
  }
  while (iVar2 = f_local._4_4_ + -1, 0 < f_local._4_4_) {
    f_local._4_4_ = iVar2;
    if ((((BOOL)f_local == 0) || (iVar2 = utf82ord(_utf_local,(uint32_t *)&rc), iVar2 < 1)) ||
       (f_local._4_4_ + 1 < iVar2)) {
      rc = (int)*_utf_local;
      _utf_local = _utf_local + 1;
      iVar2 = pchar(rc,(BOOL)f_local,_yield);
      local_28 = iVar2 + local_28;
    }
    else {
      f_local._4_4_ = f_local._4_4_ - (iVar2 + -1);
      _utf_local = _utf_local + iVar2;
      iVar2 = pchar(rc,(BOOL)f_local,_yield);
      local_28 = iVar2 + local_28;
    }
  }
  return local_28;
}

Assistant:

static int pchars8(PCRE2_SPTR8 p, int length, BOOL utf, FILE *f)
{
uint32_t c = 0;
int yield = 0;
if (length < 0) length = strlen((char *)p);
while (length-- > 0)
  {
  if (utf)
    {
    int rc = utf82ord(p, &c);
    if (rc > 0 && rc <= length + 1)   /* Mustn't run over the end */
      {
      length -= rc - 1;
      p += rc;
      yield += pchar(c, utf, f);
      continue;
      }
    }
  c = *p++;
  yield += pchar(c, utf, f);
  }
return yield;
}